

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_vmprintf(char *zFormat,__va_list_tag *ap)

{
  int iVar1;
  char *pcVar2;
  char zBase [70];
  StrAccum local_90;
  char local_68 [80];
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    local_90.zBase = local_68;
    local_90.db = (sqlite3 *)0x0;
    local_90.nChar = 0;
    local_90.nAlloc = 0x46;
    local_90.mxAlloc = 1000000000;
    local_90.tooBig = '\0';
    local_90.mallocFailed = '\0';
    local_90.useMalloc = '\x02';
    local_90.zText = local_90.zBase;
    sqlite3VXPrintf(&local_90,0,zFormat,ap);
    pcVar2 = sqlite3StrAccumFinish(&local_90);
  }
  else {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

SQLITE_API char *sqlite3_vmprintf(const char *zFormat, va_list ap){
  char *z;
  char zBase[SQLITE_PRINT_BUF_SIZE];
  StrAccum acc;
#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return 0;
#endif
  sqlite3StrAccumInit(&acc, zBase, sizeof(zBase), SQLITE_MAX_LENGTH);
  acc.useMalloc = 2;
  sqlite3VXPrintf(&acc, 0, zFormat, ap);
  z = sqlite3StrAccumFinish(&acc);
  return z;
}